

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDP.cpp
# Opt level: O1

string * __thiscall DecPOMDP::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,DecPOMDP *this)

{
  ostream *poVar1;
  long *plVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Discount factor: ",0x11);
  poVar1 = std::ostream::_M_insert<double>(this->_m_discount);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Reward type: ",0xd);
  plVar2 = (long *)std::ostream::operator<<((ostream *)local_198,this->_m_rewardType);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string DecPOMDP::SoftPrint() const
{
    stringstream ss;
    ss << "Discount factor: " << _m_discount << endl;
    ss << "Reward type: " << _m_rewardType << endl;
    return ss.str();
}